

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::TailCallTableInfo::TailCallTableInfo
          (TailCallTableInfo *this,Descriptor *descriptor,MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  *pvVar1;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *this_00;
  float fVar2;
  byte bVar3;
  Utf8CheckMode UVar4;
  int iVar5;
  MessageOptions *pMVar6;
  pointer pAVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields_00;
  pointer pSVar11;
  void *pvVar12;
  pointer pSVar13;
  TailCallTableInfo *pTVar14;
  bool bVar15;
  char cVar16;
  uint32_t tag;
  uint32_t uVar17;
  CppStringType CVar18;
  uint uVar19;
  FieldOptions *pFVar20;
  FieldOptions *pFVar21;
  optional<unsigned_int> oVar22;
  bool *pbVar23;
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *pvVar24;
  EnumDescriptor *enum_type;
  variant_alternative_t<1UL,_variant<Empty,_Field,_NonField>_> *pvVar25;
  Nonnull<const_char_*> pcVar26;
  uint8_t uVar27;
  ulong uVar28;
  byte bVar29;
  ulong uVar30;
  long lVar31;
  undefined8 *puVar32;
  int *piVar33;
  Descriptor *this_01;
  FieldDescriptor *pFVar34;
  unsigned_long v1;
  pointer pFVar35;
  TcParseFunction TVar36;
  pointer pFVar37;
  ulong uVar38;
  FieldOptions *pFVar39;
  MessageOptions *pMVar40;
  MessageOptions *pMVar41;
  uint uVar42;
  long lVar43;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_01;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> entries_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_02;
  int32_t first;
  int32_t last;
  FastFieldInfo fast_fields [32];
  FieldDescriptor *in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  local_4d8;
  TailCallTableInfo *local_4c0;
  FieldOptions *local_4b8;
  pointer local_4b0;
  Descriptor *local_4a8;
  uint32_t local_4a0;
  uint32_t local_49c;
  NumToEntryTable local_498;
  MessageOptions *local_470;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_468;
  Descriptor *local_460;
  int local_454;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *local_450;
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *local_448;
  FieldDescriptor *local_440;
  undefined1 local_438 [24];
  pointer apSStack_420 [126];
  
  pFVar35 = (pointer)ordered_fields.len_;
  local_4b8 = ordered_fields.ptr_;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fast_path_fields).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aux_entries).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_name_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar6 = descriptor->options_;
  TVar36 = kDiscardEverythingFallback;
  this_01 = descriptor;
  if (((pMVar6->field_0)._impl_.map_entry_ == false) &&
     (TVar36 = kReflectionFallback, message_options->uses_codegen == true)) {
    uVar30 = (ulong)descriptor->field_count_;
    this_01 = (Descriptor *)CONCAT71((int7)((ulong)descriptor >> 8),0 < (long)uVar30);
    if (0 < (long)uVar30) {
      this_01 = (Descriptor *)descriptor->fields_;
      if (*(char *)((long)&this_01->merged_features_[1].field_0 + 0x27) != '\0') goto LAB_002788ce;
      piVar33 = &this_01->extension_range_count_;
      uVar38 = 1;
      do {
        uVar28 = uVar38;
        if (uVar30 == uVar28) break;
        lVar43 = *(long *)piVar33;
        piVar33 = piVar33 + 0x16;
        uVar38 = uVar28 + 1;
      } while (*(char *)(lVar43 + 0x87) != '\x01');
      this_01 = (Descriptor *)CONCAT71((int7)((ulong)piVar33 >> 8),uVar28 < uVar30);
    }
    if ((char)this_01 == '\0') {
      TVar36 = message_options->is_lite | kGenericFallback;
    }
  }
LAB_002788ce:
  pvVar1 = &this->fast_path_fields;
  local_450 = &this->field_entries;
  this_00 = &this->aux_entries;
  local_468 = &this->field_name_data;
  this->fallback_function = TVar36;
  local_4c0 = this;
  local_4b0 = pFVar35;
  local_4a8 = descriptor;
  local_460 = (Descriptor *)message_options;
  if ((pMVar6->field_0)._impl_.message_set_wire_format_ == true) {
    if (pFVar35 != (pointer)0x0) {
LAB_00279dbc:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_438,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0x3a2,"ordered_fields.empty()");
LAB_00279e34:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_438);
    }
    if (message_options->uses_codegen == true) {
      local_438[0] = 'v' - message_options->is_lite;
      local_438._2_2_ = 0;
      local_438._4_2_ = 0;
      apSStack_420[0] = (pointer)CONCAT71(apSStack_420[0]._1_7_,2);
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
                  *)pvVar1,local_438);
      local_438[0] = 8;
      local_438[1] = 0;
      local_438._2_2_ = 0;
      local_438._8_8_ =
           (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            )0x0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::AuxEntry_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>>
                  *)this_00,local_438);
    }
    else {
      if (message_options->is_lite == true) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_438,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x3ac,"!message_options.is_lite");
        goto LAB_00279e34;
      }
      local_438._16_8_ = (pointer)0x0;
      apSStack_420[0] = (pointer)0x2;
      local_438[0] = 0x77;
      local_438[1] = 0;
      local_438._2_2_ = 0;
      local_438._4_2_ = 0;
      local_438._6_2_ = 0;
      local_438._8_8_ = (LogMessageData *)0x0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
      ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_const*>
                ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
                  *)pvVar1,local_438);
    }
    this->table_size_log2 = 0;
    ordered_fields_00.len_ = (size_type)message_options;
    ordered_fields_00.ptr_ = local_4b0;
    anon_unknown_36::MakeNumToEntryTable
              ((NumToEntryTable *)local_438,(anon_unknown_36 *)local_4b8,ordered_fields_00);
    (this->num_to_entry_table).skipmap32 =
         CONCAT22(local_438._2_2_,CONCAT11(local_438[1],local_438[0]));
    local_498._0_8_ =
         (this->num_to_entry_table).blocks.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_498.blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->num_to_entry_table).blocks.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_498.blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->num_to_entry_table).blocks.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->num_to_entry_table).blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_438._8_8_;
    (this->num_to_entry_table).blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_438._16_8_;
    (this->num_to_entry_table).blocks.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = apSStack_420[0];
    local_438._8_8_ =
         (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x0;
    local_438._16_8_ = (pointer)0x0;
    apSStack_420[0] = (pointer)0x0;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ::~vector((vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               *)&local_498);
    std::
    vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
    ::~vector((vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               *)(local_438 + 8));
    pFVar37 = (this->field_entries).
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    entries.len_ = ((long)(this->field_entries).
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar37 >> 3) *
                   -0x5555555555555555;
    fields.len_._0_7_ = in_stack_fffffffffffffb10;
    fields.ptr_ = (pointer)in_stack_fffffffffffffb08;
    fields.len_._7_1_ = in_stack_fffffffffffffb17;
    entries.ptr_ = pFVar37;
    anon_unknown_36::GenerateFieldNames
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_438,local_4a8,entries,
               (MessageOptions *)pFVar35,fields);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_468,local_438);
    pSVar11 = (pointer)CONCAT26(local_438._6_2_,
                                CONCAT24(local_438._4_2_,
                                         CONCAT22(local_438._2_2_,
                                                  CONCAT11(local_438[1],local_438[0]))));
    pSVar13 = (pointer)local_438._16_8_;
    goto joined_r0x00279d96;
  }
  uVar38 = (long)pFVar35 * 0x20;
  pFVar39 = local_4b8 + (long)pFVar35;
  pFVar20 = pFVar39;
  uVar30 = uVar38;
  pFVar21 = local_4b8;
  if (pFVar35 != (pointer)0x0) {
    do {
      pFVar20 = pFVar21 + 1;
      if (uVar30 - 0x20 == 0) break;
      this_01 = (Descriptor *)pFVar21->field;
      uVar30 = uVar30 - 0x20;
      pFVar21 = pFVar20;
    } while (*(int *)&this_01->sequential_field_limit_ <= pFVar20->field->number_);
  }
  if (pFVar20 != pFVar39) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x3bf,
               "std::is_sorted(ordered_fields.begin(), ordered_fields.end(), [](const auto& lhs, const auto& rhs) { return lhs.field->number() < rhs.field->number(); })"
              );
    goto LAB_00279e34;
  }
  lVar43 = (long)pFVar35 >> 2;
  pFVar21 = local_4b8;
  if (0 < lVar43) {
    pFVar21 = (FieldOptions *)((long)&local_4b8->field + (uVar38 & 0xffffffffffffff80));
    lVar31 = lVar43 + 1;
    pFVar20 = local_4b8 + 2;
    do {
      if (pFVar20[-2].is_string_inlined != false) {
        pFVar20 = pFVar20 + -2;
        goto LAB_00278bc1;
      }
      if (pFVar20[-1].is_string_inlined != false) {
        pFVar20 = pFVar20 + -1;
        goto LAB_00278bc1;
      }
      if (pFVar20->is_string_inlined != false) goto LAB_00278bc1;
      if (pFVar20[1].is_string_inlined != false) {
        pFVar20 = pFVar20 + 1;
        goto LAB_00278bc1;
      }
      lVar31 = lVar31 + -1;
      pFVar20 = pFVar20 + 4;
    } while (1 < lVar31);
  }
  lVar31 = (long)pFVar39 - (long)pFVar21 >> 5;
  if (lVar31 == 1) {
LAB_00278bb5:
    pFVar20 = pFVar21;
    if (pFVar21->is_string_inlined == false) {
      pFVar20 = pFVar39;
    }
  }
  else if (lVar31 == 2) {
LAB_00278a67:
    pFVar20 = pFVar21;
    if (pFVar21->is_string_inlined == false) {
      pFVar21 = pFVar21 + 1;
      goto LAB_00278bb5;
    }
  }
  else {
    pFVar20 = pFVar39;
    if ((lVar31 == 3) && (pFVar20 = pFVar21, pFVar21->is_string_inlined == false)) {
      pFVar21 = pFVar21 + 1;
      goto LAB_00278a67;
    }
  }
LAB_00278bc1:
  if (pFVar20 != pFVar39) {
    this_01 = (Descriptor *)0x1;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
    ::resize(this_00,1);
    pAVar7 = (this_00->
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pAVar7->type = kInlinedStringDonatedOffset;
    (pAVar7->field_1).field = (FieldDescriptor *)0x0;
  }
  pFVar21 = local_4b8;
  if (0 < lVar43) {
    pFVar21 = (FieldOptions *)((long)&local_4b8->field + (uVar38 & 0xffffffffffffff80));
    lVar43 = lVar43 + 1;
    pFVar20 = local_4b8 + 2;
    do {
      if (pFVar20[-2].should_split != false) {
        pFVar20 = pFVar20 + -2;
        goto LAB_00278c83;
      }
      if (pFVar20[-1].should_split != false) {
        pFVar20 = pFVar20 + -1;
        goto LAB_00278c83;
      }
      if (pFVar20->should_split != false) goto LAB_00278c83;
      if (pFVar20[1].should_split != false) {
        pFVar20 = pFVar20 + 1;
        goto LAB_00278c83;
      }
      lVar43 = lVar43 + -1;
      pFVar20 = pFVar20 + 4;
    } while (1 < lVar43);
  }
  lVar43 = (long)pFVar39 - (long)pFVar21 >> 5;
  if (lVar43 == 1) {
LAB_00278c77:
    pFVar20 = pFVar21;
    if (pFVar21->should_split == false) {
      pFVar20 = pFVar39;
    }
  }
  else if (lVar43 == 2) {
LAB_00278c56:
    pFVar20 = pFVar21;
    if (pFVar21->should_split == false) {
      pFVar21 = pFVar21 + 1;
      goto LAB_00278c77;
    }
  }
  else {
    pFVar20 = pFVar39;
    if ((lVar43 == 3) && (pFVar20 = pFVar21, pFVar21->should_split == false)) {
      pFVar21 = pFVar21 + 1;
      goto LAB_00278c56;
    }
  }
LAB_00278c83:
  if (pFVar20 != pFVar39) {
    this_01 = (Descriptor *)0x3;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
    ::resize(this_00,3);
    pAVar7 = (this_00->
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pAVar7[1].type = kSplitOffset;
    pAVar7[1].field_1.field = (FieldDescriptor *)0x0;
    pAVar7 = (this_00->
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pAVar7[2].type = kSplitSizeof;
    pAVar7[2].field_1.field = (FieldDescriptor *)0x0;
  }
  ordered_fields_02.len_ = (size_type)this_00;
  ordered_fields_02.ptr_ = local_4b0;
  BuildFieldEntries((vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                     *)local_438,(TailCallTableInfo *)this_01,local_460,(MessageOptions *)local_4b8,
                    ordered_fields_02,
                    (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     *)in_stack_fffffffffffffb08);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::_M_move_assign(local_450);
  pvVar12 = (void *)CONCAT26(local_438._6_2_,
                             CONCAT24(local_438._4_2_,
                                      CONCAT22(local_438._2_2_,CONCAT11(local_438[1],local_438[0])))
                            );
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,local_438._16_8_ - (long)pvVar12);
  }
  oVar22 = GetEndGroupTag(local_4a8);
  lVar43 = 0x18;
  do {
    local_438[lVar43] = 0;
    lVar43 = lVar43 + 0x20;
  } while (lVar43 != 0x418);
  uVar19 = 0x20;
  if (((ulong)oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    pbVar23 = (bool *)((long)&local_4b0->field + 1);
    uVar30 = (long)pbVar23 - ((ulong)pbVar23 >> 1 & 0x5555555555555555);
    uVar38 = (uVar30 >> 2 & 0x3333333333333333) + (uVar30 & 0x3333333333333333);
    uVar30 = 0x40;
    if (pbVar23 != (bool *)0x0) {
      uVar30 = 0x3f;
      if (pbVar23 != (bool *)0x0) {
        for (; (ulong)pbVar23 >> uVar30 == 0; uVar30 = uVar30 - 1) {
        }
      }
      uVar30 = uVar30 ^ 0x3f;
    }
    uVar28 = (ulong)(0x3f - (int)uVar30);
    if ((char)(((uVar38 >> 4) + uVar38 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) != '\x01')
    {
      uVar28 = 0x40 - uVar30;
    }
    uVar19 = 0x20;
    if (uVar28 < 5) {
      uVar19 = (uint)(1L << ((byte)uVar28 & 0x3f));
    }
  }
  uVar42 = 0;
  if (((ulong)oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> & 0x1ffffc000) == 0x100000000) {
    tag = TcParseTableBase::RecodeTagForFastParsing
                    (oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload);
    uVar17 = TcParseTableBase::TagToIdx(tag,uVar19);
    uVar8 = local_498._0_8_;
    if (uVar19 <= uVar17) {
      internal::TailCallTableInfo();
LAB_00279e46:
      internal::TailCallTableInfo();
LAB_00279e4b:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0x124,"!field->is_repeated()");
      goto LAB_00279e72;
    }
    local_498.skipmap32._0_1_ =
         't' - (oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload < 0x80);
    local_498.skipmap32._2_2_ = (uint16_t)tag;
    local_498._6_2_ = SUB82(uVar8,6);
    local_498._4_2_ =
         oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload._0_2_;
    std::
    variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
    ::operator=((variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 *)(local_438 + (ulong)uVar17 * 0x20),(NonField *)&local_498);
    uVar42 = 1 << ((byte)uVar17 & 0x1f);
  }
  pFVar37 = (local_4c0->field_entries).
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_470 = (MessageOptions *)(ulong)uVar19;
  if ((local_4c0->field_entries).
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar37) {
    lVar43 = 0;
    pFVar35 = (pointer)0x0;
    pFVar39 = local_4b8;
    do {
      if (local_4b0 == pFVar35) {
        internal::TailCallTableInfo();
        goto LAB_00279dbc;
      }
      pFVar34 = *(FieldDescriptor **)((long)&pFVar37->field + lVar43);
      bVar15 = IsFieldTypeEligibleForFastParsing(pFVar34);
      if (((((bVar15) && (pFVar39->is_implicitly_weak == false)) && (pFVar39->should_split == false)
           ) && ((bVar15 = anon_unknown_36::HasLazyRep(pFVar34,pFVar39), !bVar15 ||
                 ((bool)local_460->field_0x1 == true)))) &&
         (bVar15 = anon_unknown_36::HasLazyRep(pFVar34,pFVar39),
         !bVar15 || pFVar39->lazy_opt != kTvEnum)) {
        uVar19 = (uint)*(ushort *)((long)&pFVar37->aux_idx + lVar43);
        if (((pFVar34->type_ == '\f') || (pFVar34->type_ == '\t')) &&
           (pFVar39->is_string_inlined == true)) {
          bVar3 = pFVar34->field_0x1;
          bVar15 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar15) {
            pcVar26 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar15,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar26 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_498,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar26);
            goto LAB_00279e72;
          }
          if ((pFVar34->field_0x1 & 0x20) != 0) goto LAB_00279e4b;
          uVar19 = *(uint *)((long)&pFVar37->inlined_string_idx + lVar43);
        }
        if ((0x1f < *(int *)((long)&pFVar37->hasbit_idx + lVar43)) || (0xff < (int)uVar19))
        goto LAB_00278efd;
        local_440 = *(FieldDescriptor **)((long)&pFVar37->field + lVar43);
        local_49c = GetRecodedTagForFastParsing(local_440);
        local_4a0 = TcParseTableBase::TagToIdx(local_49c,(uint32_t)local_470);
        if ((uint)local_470 <= local_4a0) goto LAB_00279e46;
        lVar31 = (ulong)local_4a0 * 0x20;
        if ((*(char *)(apSStack_420 + (ulong)local_4a0 * 4) == '\x02') ||
           ((pvVar24 = (variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                        *)(local_438 + lVar31),
            *(char *)(apSStack_420 + (ulong)local_4a0 * 4) == '\x01' &&
            (pFVar39->presence_probability <= *(float *)((long)apSStack_420 + lVar31 + -4)))))
        goto LAB_00278efd;
        local_498._0_8_ = (pointer)0x0;
        local_498.blocks.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_498.blocks.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_498.blocks.
                              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                              ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffff0000);
        pFVar34 = *(FieldDescriptor **)((long)&pFVar37->field + lVar43);
        in_stack_fffffffffffffb17 = *(undefined1 *)((long)&pFVar37->aux_idx + lVar43);
        local_448 = pvVar24;
        if (((pFVar34->type_ == '\f') || (pFVar34->type_ == '\t')) &&
           (pFVar39->is_string_inlined == true)) {
          bVar3 = pFVar34->field_0x1;
          bVar15 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar15) {
            pcVar26 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar15,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar26 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_4d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar26);
            goto LAB_00279ecc;
          }
          if ((pFVar34->field_0x1 & 0x20) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_4d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                       ,0xa6,"!field->is_repeated()");
            goto LAB_00279ecc;
          }
          in_stack_fffffffffffffb17 = *(undefined1 *)((long)&pFVar37->inlined_string_idx + lVar43);
        }
        switch(pFVar34->type_) {
        case '\x01':
        case '\x06':
        case '\x10':
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          if (bVar15) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '*';
          }
          else {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar15) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((pFVar34->field_0x1 & 0x20) == 0) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '&';
            }
            else {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '(';
            }
          }
          break;
        case '\x02':
        case '\a':
        case '\x0f':
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          if (bVar15) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '$';
          }
          else {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar15) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((pFVar34->field_0x1 & 0x20) == 0) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = ' ';
            }
            else {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\"';
            }
          }
          break;
        case '\x03':
        case '\x04':
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          if (bVar15) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '\x12';
          }
          else {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar15) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((pFVar34->field_0x1 & 0x20) == 0) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\x0e';
            }
            else {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\x10';
            }
          }
          break;
        case '\x05':
        case '\r':
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          if (bVar15) {
            iVar5 = pFVar34->number_;
            goto LAB_002790ec;
          }
          bVar3 = pFVar34->field_0x1;
          bVar15 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar15) {
            pcVar26 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar15,0xbf < bVar3,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar26 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_4d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar26);
            goto LAB_00279ecc;
          }
LAB_00279329:
          if ((pFVar34->field_0x1 & 0x20) == 0) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '\b';
          }
          else {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '\n';
          }
          break;
        case '\b':
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          in_stack_fffffffffffffb08 = pFVar34;
          if (bVar15) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '\x06';
          }
          else {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar15) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              in_stack_fffffffffffffb08 = pFVar34;
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((in_stack_fffffffffffffb08->field_0x1 & 0x20) == 0) {
              bVar15 = in_stack_fffffffffffffb08->number_ < 0x10;
              cVar16 = '\x02';
            }
            else {
              bVar15 = in_stack_fffffffffffffb08->number_ < 0x10;
              cVar16 = '\x04';
            }
          }
          break;
        case '\t':
          UVar4 = (&pFVar37->utf8_check_mode)[lVar43];
          if (UVar4 == kNone) {
            CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
            if (CVar18 == kCord) goto LAB_002791c8;
            CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
            if ((CVar18 == kView) && (pFVar39->use_micro_string == true)) goto LAB_00279432;
            if (pFVar39->is_string_inlined == true) {
              iVar5 = pFVar34->number_;
              goto LAB_002795a0;
            }
            bVar15 = FieldDescriptor::is_repeated(pFVar34);
            iVar5 = pFVar34->number_;
            if (bVar15) goto LAB_0027982c;
LAB_00279710:
            bVar15 = iVar5 < 0x10;
            cVar16 = 'D';
            in_stack_fffffffffffffb08 = pFVar34;
          }
          else if (UVar4 == kVerify) {
            CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
            if (CVar18 == kCord) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = 'X';
              in_stack_fffffffffffffb08 = pFVar34;
            }
            else {
              CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
              in_stack_fffffffffffffb08 = pFVar34;
              if ((CVar18 == kView) && (pFVar39->use_micro_string == true)) {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = '^';
              }
              else if (pFVar39->is_string_inlined == true) {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = 'R';
              }
              else {
                bVar15 = FieldDescriptor::is_repeated(pFVar34);
                in_stack_fffffffffffffb08 = pFVar34;
                if (bVar15) {
                  bVar15 = pFVar34->number_ < 0x10;
                  cVar16 = 'J';
                }
                else {
                  bVar15 = pFVar34->number_ < 0x10;
                  cVar16 = 'H';
                }
              }
            }
          }
          else {
            if (UVar4 != kStrict) goto switchD_0027909b_default;
            CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
            if (CVar18 == kCord) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = 'Z';
              in_stack_fffffffffffffb08 = pFVar34;
            }
            else {
              CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
              in_stack_fffffffffffffb08 = pFVar34;
              if ((CVar18 == kView) && (pFVar39->use_micro_string == true)) {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = '`';
              }
              else if (pFVar39->is_string_inlined == true) {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = 'T';
              }
              else {
                bVar15 = FieldDescriptor::is_repeated(pFVar34);
                in_stack_fffffffffffffb08 = pFVar34;
                if (bVar15) {
                  bVar15 = pFVar34->number_ < 0x10;
                  cVar16 = 'N';
                }
                else {
                  bVar15 = pFVar34->number_ < 0x10;
                  cVar16 = 'L';
                }
              }
            }
          }
          break;
        case '\n':
          bVar3 = pFVar34->field_0x1;
          bVar15 = (bool)((bVar3 & 0x20) >> 5);
          bVar29 = 0xbf < bVar3 ^ bVar15;
          if (pFVar39->use_direct_tcparser_table == true) {
            if (bVar29 == 0) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((pFVar34->field_0x1 & 0x20) == 0) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = 'f';
            }
            else {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = 'h';
            }
          }
          else {
            if (bVar29 == 0) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((pFVar34->field_0x1 & 0x20) == 0) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = 'b';
            }
            else {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = 'd';
            }
          }
          break;
        case '\v':
          bVar15 = anon_unknown_36::HasLazyRep(pFVar34,pFVar39);
          if (bVar15) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = 'r';
            in_stack_fffffffffffffb08 = pFVar34;
          }
          else {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            bVar29 = 0xbf < bVar3 ^ bVar15;
            if (pFVar39->use_direct_tcparser_table == true) {
              if (bVar29 == 0) {
                pcVar26 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                    (bVar15,0xbf < bVar3,
                                     "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED")
                ;
              }
              if (pcVar26 != (Nonnull<const_char_*>)0x0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_4d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb54,pcVar26);
                goto LAB_00279ecc;
              }
              in_stack_fffffffffffffb08 = pFVar34;
              if ((pFVar34->field_0x1 & 0x20) == 0) {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = 'n';
              }
              else {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = 'p';
              }
            }
            else {
              if (bVar29 == 0) {
                pcVar26 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                    (bVar15,0xbf < bVar3,
                                     "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED")
                ;
              }
              if (pcVar26 != (Nonnull<const_char_*>)0x0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_4d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb54,pcVar26);
                goto LAB_00279ecc;
              }
              in_stack_fffffffffffffb08 = pFVar34;
              if ((pFVar34->field_0x1 & 0x20) == 0) {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = 'j';
              }
              else {
                bVar15 = pFVar34->number_ < 0x10;
                cVar16 = 'l';
              }
            }
          }
          break;
        case '\f':
          CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
          if (CVar18 == kCord) {
LAB_002791c8:
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = 'V';
            in_stack_fffffffffffffb08 = pFVar34;
          }
          else {
            CVar18 = FieldDescriptor::cpp_string_type(pFVar34);
            if ((CVar18 == kView) && (pFVar39->use_micro_string == true)) {
LAB_00279432:
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\\';
              in_stack_fffffffffffffb08 = pFVar34;
            }
            else if (pFVar39->is_string_inlined == true) {
              iVar5 = pFVar34->number_;
LAB_002795a0:
              bVar15 = iVar5 < 0x10;
              cVar16 = 'P';
              in_stack_fffffffffffffb08 = pFVar34;
            }
            else {
              bVar3 = pFVar34->field_0x1;
              bVar15 = (bool)((bVar3 & 0x20) >> 5);
              if (0xbf < bVar3 == bVar15) {
                pcVar26 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                    (bVar15,0xbf < bVar3,
                                     "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED")
                ;
              }
              if (pcVar26 != (Nonnull<const_char_*>)0x0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_4d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb54,pcVar26);
                goto LAB_00279ecc;
              }
              iVar5 = pFVar34->number_;
              if ((pFVar34->field_0x1 & 0x20) == 0) goto LAB_00279710;
LAB_0027982c:
              bVar15 = iVar5 < 0x10;
              cVar16 = 'F';
              in_stack_fffffffffffffb08 = pFVar34;
            }
          }
          break;
        case '\x0e':
          bVar15 = anon_unknown_36::TreatEnumAsInt(pFVar34);
          if (!bVar15) {
            enum_type = FieldDescriptor::enum_type(pFVar34);
            bVar15 = anon_unknown_36::GetEnumValidationRange
                               (enum_type,(int32_t *)&local_4d8,&local_454);
            uVar19 = 0;
            if ((bVar15) &&
               (uVar19 = 1,
               (uint)local_4d8.
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start < 2 && local_454 < 0x80)) {
              uVar19 = 3 - ((uint)local_4d8.
                                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0);
            }
            (*(code *)((long)&DAT_0045a1d0 + (long)(int)(&DAT_0045a1d0)[uVar19]))(pFVar34);
            return;
          }
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          if (!bVar15) {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar15) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            in_stack_fffffffffffffb08 = pFVar34;
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            goto LAB_00279329;
          }
          iVar5 = pFVar34->number_;
          in_stack_fffffffffffffb08 = pFVar34;
LAB_002790ec:
          bVar15 = iVar5 < 0x10;
          cVar16 = '\f';
          break;
        case '\x11':
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          if (bVar15) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '\x18';
          }
          else {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar15) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((pFVar34->field_0x1 & 0x20) == 0) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\x14';
            }
            else {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\x16';
            }
          }
          break;
        case '\x12':
          bVar15 = FieldDescriptor::is_packed(pFVar34);
          if (bVar15) {
            bVar15 = pFVar34->number_ < 0x10;
            cVar16 = '\x1e';
          }
          else {
            bVar3 = pFVar34->field_0x1;
            bVar15 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar15) {
              pcVar26 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar15,0xbf < bVar3,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar26 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_4d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar26);
              goto LAB_00279ecc;
            }
            if ((pFVar34->field_0x1 & 0x20) == 0) {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\x1a';
            }
            else {
              bVar15 = pFVar34->number_ < 0x10;
              cVar16 = '\x1c';
            }
          }
          break;
        default:
switchD_0027909b_default:
          cVar16 = '\0';
          goto LAB_00279956;
        }
        cVar16 = cVar16 - bVar15;
LAB_00279956:
        if (cVar16 == '\0') {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_4d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                     ,0xfa,"picked != TcParseFunction::kNone");
LAB_00279ecc:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_4d8);
        }
        fVar2 = pFVar39->presence_probability;
        (local_448->
        super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        ).
        super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        ._M_index = 0xff;
        *(char *)&(local_448->
                  super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  ).
                  super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  .
                  super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                  ._M_u = cVar16;
        *(undefined8 *)
         ((long)&(local_448->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 1) = local_498._0_8_;
        ((__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
          *)((long)&(local_448->
                    super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                    ).
                    super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                    .
                    super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                    .
                    super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                    .
                    super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                    .
                    super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                    ._M_u + 9))->
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             = (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )local_498.blocks.
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined2 *)
         ((long)&(local_448->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 0x11) =
             local_498.blocks.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish._0_2_;
        *(undefined1 *)
         ((long)&(local_448->
                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ).
                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 .
                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                 ._M_u + 0x13) = in_stack_fffffffffffffb17;
        *(float *)((long)&(local_448->
                          super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          ).
                          super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          .
                          super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                          ._M_u + 0x14) = fVar2;
        (local_448->
        super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        ).
        super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        .
        super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
        ._M_index = '\x01';
        pvVar25 = std::
                  get<1ul,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                            (local_448);
        pvVar25->field = local_440;
        pvVar25->coded_tag = (uint16_t)local_49c;
        iVar5 = *(int *)((long)&pFVar37->hasbit_idx + lVar43);
        uVar27 = (uint8_t)iVar5;
        if (iVar5 < 0) {
          uVar27 = '?';
        }
        pvVar25->hasbit_idx = uVar27;
        uVar42 = uVar42 | (uint)(0.05 <= pFVar39->presence_probability) << ((byte)local_4a0 & 0x1f);
      }
LAB_00278efd:
      pFVar35 = (pointer)((long)&pFVar35->field + 1);
      pFVar37 = (local_4c0->field_entries).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar39 = pFVar39 + 1;
      lVar43 = lVar43 + 0x18;
    } while (pFVar35 < (pointer)(((long)(local_4c0->field_entries).
                                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar37
                                 >> 3) * -0x5555555555555555));
  }
  pMVar41 = local_470;
  if (1 < (uint)local_470) {
    do {
      pMVar40 = (MessageOptions *)((ulong)pMVar41 >> 1);
      uVar19 = uVar42 >> ((byte)pMVar40 & 0x1f);
      if ((uVar19 & uVar42) != 0) break;
      if ((MessageOptions *)0x1 < pMVar41) {
        puVar32 = (undefined8 *)local_438;
        lVar43 = 0;
        do {
          if (((uVar42 >> ((int)pMVar40 + (int)lVar43 & 0x1fU) & 1) != 0) ||
             (*(char *)(puVar32 + 3) == '\0')) {
            uVar8 = puVar32[(long)pMVar40 * 4];
            uVar9 = (puVar32 + (long)pMVar40 * 4)[1];
            uVar10 = (puVar32 + (long)pMVar40 * 4 + 2)[1];
            puVar32[2] = puVar32[(long)pMVar40 * 4 + 2];
            puVar32[3] = uVar10;
            *puVar32 = uVar8;
            puVar32[1] = uVar9;
          }
          lVar43 = lVar43 + 1;
          puVar32 = puVar32 + 4;
        } while (pMVar40 != (MessageOptions *)lVar43);
      }
      uVar42 = uVar42 | uVar19;
      bVar15 = (MessageOptions *)0x3 < pMVar41;
      pMVar41 = pMVar40;
    } while (bVar15);
  }
  pMVar40 = pMVar41;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
  ::_M_assign_aux<google::protobuf::internal::TailCallTableInfo::FastFieldInfo*>
            ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
              *)pvVar1,local_438,local_438 + (long)pMVar41 * 0x20);
  pFVar35 = local_4b0;
  pTVar14 = local_4c0;
  if (pMVar41 == (MessageOptions *)0x0) {
    uVar19 = 0x40;
  }
  else {
    lVar43 = 0x3f;
    if (pMVar41 != (MessageOptions *)0x0) {
      for (; (ulong)pMVar41 >> lVar43 == 0; lVar43 = lVar43 + -1) {
      }
    }
    uVar19 = (uint)lVar43 ^ 0x3f;
  }
  ordered_fields_01.len_._0_4_ = 0x3f - uVar19;
  local_4c0->table_size_log2 = (int)ordered_fields_01.len_;
  ordered_fields_01.ptr_ = local_4b0;
  ordered_fields_01.len_._4_4_ = 0;
  anon_unknown_36::MakeNumToEntryTable(&local_498,(anon_unknown_36 *)local_4b8,ordered_fields_01);
  (pTVar14->num_to_entry_table).skipmap32 = local_498.skipmap32;
  local_4d8.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pTVar14->num_to_entry_table).blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4d8.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pTVar14->num_to_entry_table).blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4d8.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pTVar14->num_to_entry_table).blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pTVar14->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_498.blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pTVar14->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_498.blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pTVar14->num_to_entry_table).blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_498.blocks.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_498.blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.blocks.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ::~vector(&local_4d8);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ::~vector(&local_498.blocks);
  v1 = ((long)(pTVar14->field_entries).
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pTVar14->field_entries).
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (v1 - (long)pFVar35 == 0) {
    pcVar26 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar26 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                        (v1,(unsigned_long)pFVar35,"field_entries.size() == ordered_fields.size()");
  }
  if (pcVar26 == (Nonnull<const_char_*>)0x0) {
    pFVar37 = (pTVar14->field_entries).
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    entries_00.len_ =
         ((long)(pTVar14->field_entries).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar37 >> 3) *
         -0x5555555555555555;
    fields_00.len_._0_7_ = in_stack_fffffffffffffb10;
    fields_00.ptr_ = (pointer)in_stack_fffffffffffffb08;
    fields_00.len_._7_1_ = in_stack_fffffffffffffb17;
    entries_00.ptr_ = pFVar37;
    anon_unknown_36::GenerateFieldNames
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_498,local_4a8,
               entries_00,pMVar40,fields_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_468,&local_498)
    ;
    pSVar11 = (pointer)local_498._0_8_;
    pSVar13 = local_498.blocks.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish;
joined_r0x00279d96:
    if (pSVar11 != (pointer)0x0) {
      operator_delete(pSVar11,(long)pSVar13 - (long)pSVar11);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_498,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
             ,0x407,pcVar26);
LAB_00279e72:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_498)
  ;
}

Assistant:

TailCallTableInfo::TailCallTableInfo(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields) {
  fallback_function =
      // Map entries discard unknown data
      descriptor->options().map_entry()
          ? TcParseFunction::kDiscardEverythingFallback
      // Reflection and weak messages have the reflection fallback
      : !message_options.uses_codegen || HasWeakFields(descriptor)
          ? TcParseFunction::kReflectionFallback
      // Codegen messages have lite and non-lite version
      : message_options.is_lite ? TcParseFunction::kGenericFallbackLite
                                : TcParseFunction::kGenericFallback;

  if (descriptor->options().message_set_wire_format()) {
    ABSL_DCHECK(ordered_fields.empty());
    if (message_options.uses_codegen) {
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          message_options.is_lite
              ? TcParseFunction::kMessageSetWireFormatParseLoopLite
              : TcParseFunction::kMessageSetWireFormatParseLoop,
          0, 0}}};

      aux_entries = {{kSelfVerifyFunc}};
    } else {
      ABSL_DCHECK(!message_options.is_lite);
      // The message set parser loop only handles codegen because it hardcodes
      // the generated extension registry. For reflection, use the reflection
      // loop which can handle arbitrary message factories.
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          TcParseFunction::kReflectionParseLoop, 0, 0}}};
    }

    table_size_log2 = 0;
    num_to_entry_table = MakeNumToEntryTable(ordered_fields);
    field_name_data = GenerateFieldNames(descriptor, field_entries,
                                         message_options, ordered_fields);

    return;
  }

  ABSL_DCHECK(std::is_sorted(ordered_fields.begin(), ordered_fields.end(),
                             [](const auto& lhs, const auto& rhs) {
                               return lhs.field->number() < rhs.field->number();
                             }));
  // If this message has any inlined string fields, store the donation state
  // offset in the first auxiliary entry, which is kInlinedStringAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.is_string_inlined; })) {
    aux_entries.resize(kInlinedStringAuxIdx + 1);  // Allocate our slot
    aux_entries[kInlinedStringAuxIdx] = {kInlinedStringDonatedOffset};
  }

  // If this message is split, store the split pointer offset in the second
  // and third auxiliary entries, which are kSplitOffsetAuxIdx and
  // kSplitSizeAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.should_split; })) {
    static_assert(kSplitOffsetAuxIdx + 1 == kSplitSizeAuxIdx, "");
    aux_entries.resize(kSplitSizeAuxIdx + 1);  // Allocate our 2 slots
    aux_entries[kSplitOffsetAuxIdx] = {kSplitOffset};
    aux_entries[kSplitSizeAuxIdx] = {kSplitSizeof};
  }

  field_entries = BuildFieldEntries(descriptor, message_options, ordered_fields,
                                    aux_entries);

  auto end_group_tag = GetEndGroupTag(descriptor);

  FastFieldInfo fast_fields[TcParseTableBase::kMaxFastFields];
  // Bit mask for the fields that are "important". Unimportant fields might be
  // set but it's ok if we lose them from the fast table. For example, cold
  // fields.
  uint32_t important_fields = 0;
  static_assert(
      sizeof(important_fields) * 8 >= TcParseTableBase::kMaxFastFields, "");
  // The largest table we allow has the same number of entries as the
  // message has fields, rounded up to the next power of 2 (e.g., a message
  // with 5 fields can have a fast table of size 8). A larger table *might*
  // cover more fields in certain cases, but a larger table in that case
  // would have mostly empty entries; so, we cap the size to avoid
  // pathologically sparse tables.
  // However, if this message uses group encoding, the tables are sometimes very
  // sparse because the fields in the group avoid using the same field
  // numbering as the parent message (even though currently, the proto
  // compiler allows the overlap, and there is no possible conflict.)
  // NOTE: The +1 is to maintain the existing behavior that does not match the
  // documented one. When the number of fields is exactly a power of two we
  // allow double that.
  size_t num_fast_fields =
      FastParseTableSize(ordered_fields.size(), end_group_tag);
  PopulateFastFields(
      end_group_tag, field_entries, message_options, ordered_fields,
      absl::MakeSpan(fast_fields, num_fast_fields), important_fields);
  // If we can halve the table without dropping important fields, do it.
  while (num_fast_fields > 1 &&
         (important_fields & (important_fields >> num_fast_fields / 2)) == 0) {
    // Half the table by merging fields.
    num_fast_fields /= 2;
    for (size_t i = 0; i < num_fast_fields; ++i) {
      size_t merge_i = i + num_fast_fields;
      // Overwrite the surviving entries if the discarded half contains an
      // important field (meaning the surviving entry is not) or the surviving
      // entry is empty.
      if (((important_fields >> merge_i) & 1) != 0 ||
          fast_fields[i].is_empty()) {
        fast_fields[i] = fast_fields[merge_i];
      }
    }
    important_fields |= important_fields >> num_fast_fields;
  }

  fast_path_fields.assign(fast_fields, fast_fields + num_fast_fields);
  table_size_log2 = absl::bit_width(num_fast_fields) - 1;

  num_to_entry_table = MakeNumToEntryTable(ordered_fields);
  ABSL_CHECK_EQ(field_entries.size(), ordered_fields.size());
  field_name_data = GenerateFieldNames(descriptor, field_entries,
                                       message_options, ordered_fields);
}